

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O2

void lyd_np_cont_dflt_set(lyd_node *parent)

{
  uint uVar1;
  lysc_node *plVar2;
  lyd_node *plVar3;
  
  while ((((parent != (lyd_node *)0x0 &&
           (plVar2 = *(lysc_node **)((long)&((lyd_node_inner *)parent)->field_0 + 8),
           plVar2 != (lysc_node *)0x0)) &&
          (uVar1 = *(uint32_t *)((long)&((lyd_node_inner *)parent)->field_0 + 4), (uVar1 & 1) == 0))
         && ((plVar2->nodetype == 1 && ((plVar2->flags & 0x80) == 0))))) {
    for (plVar3 = lyd_child(parent); plVar3 != (lyd_node *)0x0; plVar3 = plVar3->next) {
      if ((plVar3->flags & 1) == 0) {
        return;
      }
    }
    *(uint *)((long)&((lyd_node_inner *)parent)->field_0 + 4) = uVar1 | 1;
    parent = *(lyd_node **)((long)&((lyd_node_inner *)parent)->field_0 + 0x10);
  }
  return;
}

Assistant:

void
lyd_np_cont_dflt_set(struct lyd_node *parent)
{
    const struct lyd_node *child;

    while (parent) {
        if (!parent->schema || (parent->flags & LYD_DEFAULT) || !lysc_is_np_cont(parent->schema)) {
            /* not a non-dflt NP container */
            break;
        }

        LY_LIST_FOR(lyd_child(parent), child) {
            if (!(child->flags & LYD_DEFAULT)) {
                break;
            }
        }
        if (child) {
            /* explicit child, no dflt change */
            break;
        }

        /* set the dflt flag */
        parent->flags |= LYD_DEFAULT;

        /* check all parent containers */
        parent = lyd_parent(parent);
    }
}